

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_address.cpp
# Opt level: O0

void __thiscall
Address_ElementsInvalidAddressTest_Test::TestBody(Address_ElementsInvalidAddressTest_Test *this)

{
  bool bVar1;
  Message *pMVar2;
  AssertHelper local_5f8;
  Message local_5f0 [2];
  CfdException *anon_var_0_2;
  Address local_5c8;
  byte local_449;
  char *pcStack_448;
  bool gtest_caught_expected_2;
  ConstCharPtr gtest_msg_2;
  string local_438;
  Pubkey local_418;
  undefined1 local_400 [8];
  ByteData160 hash;
  Message local_3e0 [2];
  CfdException *anon_var_0_1;
  allocator local_3b1;
  string local_3b0;
  Address local_390;
  byte local_211;
  char *pcStack_210;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  Message local_200 [2];
  CfdException *anon_var_0;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> local_1e8;
  allocator local_1c9;
  string local_1c8;
  Address local_1a8;
  byte local_19;
  char *pcStack_18;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  Address_ElementsInvalidAddressTest_Test *this_local;
  
  gtest_msg.value = (char *)this;
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffffe8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffffe8);
  if (bVar1) {
    local_19 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1c8,"C76uVp7JJqeUKht3wQXajaaGvUJAfEDnPx",&local_1c9);
      cfd::core::GetElementsAddressFormatList();
      cfd::core::Address::Address(&local_1a8,&local_1c8,&local_1e8);
      cfd::core::Address::~Address(&local_1a8);
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector(&local_1e8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
    }
    if ((local_19 & 1) == 0) {
      pcStack_18 = 
      "Expected: Address(\"C76uVp7JJqeUKht3wQXajaaGvUJAfEDnPx\", GetElementsAddressFormatList()) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_003a672f;
    }
  }
  else {
LAB_003a672f:
    testing::Message::Message(local_200);
    pMVar2 = testing::Message::operator<<(local_200,(char (*) [5])"pref");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x3f5,pcStack_18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_1,pMVar2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_1);
    testing::Message::~Message(local_200);
  }
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffdf0,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffdf0);
  if (bVar1) {
    local_211 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_3b0,"DbJDuZXuDVSiYB6QXb5fn",&local_3b1);
      cfd::core::GetElementsAddressFormatList();
      cfd::core::Address::Address
                (&local_390,&local_3b0,
                 (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)&anon_var_0_1);
      cfd::core::Address::~Address(&local_390);
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )&anon_var_0_1);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
    }
    if ((local_211 & 1) == 0) {
      pcStack_210 = 
      "Expected: Address(\"DbJDuZXuDVSiYB6QXb5fn\", GetElementsAddressFormatList()) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_003a698c;
    }
  }
  else {
LAB_003a698c:
    testing::Message::Message(local_3e0);
    pMVar2 = testing::Message::operator<<(local_3e0,(char (*) [4])"len");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x3f7,pcStack_210);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage,pMVar2);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(local_3e0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_438,
             "02d21c625759280111907a06df050cccbc875b11a50bdafa71dae5d1e8695ba82e",
             (allocator *)((long)&gtest_msg_2.value + 7));
  cfd::core::Pubkey::Pubkey(&local_418,&local_438);
  cfd::core::HashUtil::Hash160((ByteData160 *)local_400,&local_418);
  cfd::core::Pubkey::~Pubkey(&local_418);
  std::__cxx11::string::~string((string *)&local_438);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg_2.value + 7));
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffbb8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffbb8);
  if (bVar1) {
    local_449 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::GetElementsAddressFormatList();
      cfd::core::Address::Address
                (&local_5c8,kCfdConnectionError,kP2pkhAddress,(ByteData160 *)local_400,
                 (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)&anon_var_0_2);
      cfd::core::Address::~Address(&local_5c8);
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )&anon_var_0_2);
    }
    if ((local_449 & 1) != 0) goto LAB_003a6d23;
    pcStack_448 = 
    "Expected: Address(ElementsNetType::kNetTypeNum, ElementsAddressType::kP2pkhAddress, hash, GetElementsAddressFormatList()) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_5f0);
  pMVar2 = testing::Message::operator<<(local_5f0,(char (*) [4])0x68e8f0);
  testing::internal::AssertHelper::AssertHelper
            (&local_5f8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
             ,0x3fe,pcStack_448);
  testing::internal::AssertHelper::operator=(&local_5f8,pMVar2);
  testing::internal::AssertHelper::~AssertHelper(&local_5f8);
  testing::Message::~Message(local_5f0);
LAB_003a6d23:
  cfd::core::ByteData160::~ByteData160((ByteData160 *)local_400);
  return;
}

Assistant:

TEST(Address, ElementsInvalidAddressTest) {
  // invalid address prefix [base58(01 + pubkey hash)]
  EXPECT_THROW(Address("C76uVp7JJqeUKht3wQXajaaGvUJAfEDnPx", GetElementsAddressFormatList()),
      CfdException)<< "pref";
  // invalid data (decode error)
  EXPECT_THROW(Address("DbJDuZXuDVSiYB6QXb5fn", GetElementsAddressFormatList()), CfdException)<< "len";

  ByteData160 hash =
      HashUtil::Hash160(
          Pubkey(
              "02d21c625759280111907a06df050cccbc875b11a50bdafa71dae5d1e8695ba82e"));
  // invalid net type
  EXPECT_THROW(Address(ElementsNetType::kNetTypeNum, ElementsAddressType::kP2pkhAddress, hash, GetElementsAddressFormatList()), CfdException)<< "net";
}